

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

void Bac_ManMarkNodesAbc(Bac_Man_t *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_34;
  int local_30;
  int Count;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  Bac_Man_t *p_local;
  
  local_34 = 0;
  iVar1 = Vec_IntSize(&p->vBuf2LeafNtk);
  if (iVar1 != pNtk->nBarBufs2) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == pNtk->nBarBufs2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x1be,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
  }
  for (Count = 0; iVar1 = Abc_NtkPiNum(pNtk), Count < iVar1; Count = Count + 1) {
    pAVar2 = Abc_NtkPi(pNtk,Count);
    (pAVar2->field_6).iTemp = 1;
  }
  for (Count = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Count < iVar1; Count = Count + 1) {
    pAVar2 = Abc_NtkObj(pNtk,Count);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      iVar1 = Abc_ObjIsBarBuf(pAVar2);
      if (iVar1 == 0) {
        iVar1 = Abc_NodeIsSeriousGate(pAVar2);
        if (iVar1 != 0) {
          pAVar3 = Abc_ObjFanin0(pAVar2);
          (pAVar2->field_6).iTemp = (pAVar3->field_6).iTemp;
          for (local_30 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_30 < iVar1;
              local_30 = local_30 + 1) {
            pAVar3 = Abc_ObjFanin(pAVar2,local_30);
            if ((pAVar2->field_6).iTemp != (pAVar3->field_6).iTemp) {
              __assert_fail("pObj->iTemp == pFanin->iTemp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                            ,0x1c9,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
            }
          }
        }
      }
      else {
        iVar1 = Vec_IntEntry(&p->vBuf2LeafNtk,local_34);
        (pAVar2->field_6).iTemp = iVar1;
        local_34 = local_34 + 1;
      }
    }
  }
  for (Count = 0; iVar1 = Abc_NtkPoNum(pNtk), Count < iVar1; Count = Count + 1) {
    pAVar2 = Abc_NtkPo(pNtk,Count);
    pAVar3 = Abc_ObjFanin0(pAVar2);
    iVar1 = Abc_NodeIsSeriousGate(pAVar3);
    if (iVar1 != 0) {
      pAVar3 = Abc_ObjFanin0(pAVar2);
      if ((pAVar3->field_6).iTemp != 1) {
        __assert_fail("Abc_ObjFanin0(pObj)->iTemp == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                      ,0x1d0,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
      }
      pAVar3 = Abc_ObjFanin0(pAVar2);
      (pAVar2->field_6).iTemp = (pAVar3->field_6).iTemp;
    }
  }
  if (local_34 == pNtk->nBarBufs2) {
    return;
  }
  __assert_fail("Count == pNtk->nBarBufs2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                ,0x1d3,"void Bac_ManMarkNodesAbc(Bac_Man_t *, Abc_Ntk_t *)");
}

Assistant:

void Bac_ManMarkNodesAbc( Bac_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin; int i, k, Count = 0;
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == pNtk->nBarBufs2 );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->iTemp = 1;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjIsBarBuf(pObj) )
            pObj->iTemp = Vec_IntEntry( &p->vBuf2LeafNtk, Count++ );
        else if ( Abc_NodeIsSeriousGate(pObj) )
        {
            pObj->iTemp = Abc_ObjFanin0(pObj)->iTemp;
            Abc_ObjForEachFanin( pObj, pFanin, k )
                assert( pObj->iTemp == pFanin->iTemp );
        }
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsSeriousGate(Abc_ObjFanin0(pObj)) )
            continue;
        assert( Abc_ObjFanin0(pObj)->iTemp == 1 );
        pObj->iTemp = Abc_ObjFanin0(pObj)->iTemp;
    }
    assert( Count == pNtk->nBarBufs2 );
}